

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  AlphaNum local_c8;
  AlphaNum local_98;
  AlphaNum local_68;
  undefined8 local_38;
  char *local_30;
  
  local_c8.piece_._M_str = *(char **)(*(long *)(this + 8) + 8);
  local_c8.piece_._M_len = *(undefined8 *)(*(long *)(this + 8) + 0x10);
  local_38 = 0x26;
  local_30 = "Error while parsing option value for \"";
  local_68.piece_._M_len = (size_t)**(ushort **)(**(long **)this + 8);
  local_68.piece_._M_str =
       (char *)(~local_68.piece_._M_len + (long)*(ushort **)(**(long **)this + 8));
  local_98.piece_._M_len = 3;
  local_98.piece_._M_str = "\": ";
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_38,&local_68,&local_98,&local_c8,
                    (AlphaNum *)local_c8.piece_._M_len);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}